

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_NlsResidual_MassIdent(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  N_Vector in_RDI;
  N_Vector X [3];
  realtype c [3];
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  N_Vector in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                       (ARKodeMem *)in_stack_ffffffffffffff88,(ARKodeARKStepMem *)0xedf97e);
  if (local_4 == 0) {
    N_VLinearSum((realtype)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98,(realtype)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88,(N_Vector)0xedf9c0);
    iVar1 = (**(code **)(local_30 + 0x88))
                      (*(undefined8 *)(local_28 + 0x198),*(undefined8 *)(local_28 + 0x108),
                       *(undefined8 *)
                        (*(long *)(local_30 + 0x30) + (long)*(int *)(local_30 + 0x58) * 8),
                       *(undefined8 *)(local_28 + 0x10));
    *(long *)(local_30 + 0x178) = *(long *)(local_30 + 0x178) + 1;
    if (iVar1 < 0) {
      local_4 = -8;
    }
    else if (iVar1 < 1) {
      iVar1 = N_VLinearCombination
                        (in_stack_ffffffffffffffa4,
                         *(realtype **)
                          (*(long *)(local_30 + 0x30) + (long)*(int *)(local_30 + 0x58) * 8),
                         *(N_Vector **)(local_30 + 0x38),in_RDI);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x1c;
      }
    }
    else {
      local_4 = 9;
    }
  }
  return local_4;
}

Assistant:

int arkStep_NlsResidual_MassIdent(N_Vector zcor, N_Vector r, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;
  realtype c[3];
  N_Vector X[3];

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_NlsResidual_MassIdent",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS */
  retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage],
                            ark_mem->user_data);
  step_mem->nfi++;
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* compute residual via linear combination */
  c[0] = ONE;
  X[0] = zcor;
  c[1] = -ONE;
  X[1] = step_mem->sdata;
  c[2] = -step_mem->gamma;
  X[2] = step_mem->Fi[step_mem->istage];
  retval = N_VLinearCombination(3, c, X, r);
  if (retval != 0)  return(ARK_VECTOROP_ERR);
  return(ARK_SUCCESS);
}